

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sh4asm_test.c
# Opt level: O2

_Bool test_inst(char *inst)

{
  char cVar1;
  uint16_t auVar2 [1];
  size_t sVar3;
  __int32_t **pp_Var4;
  undefined8 extraout_RDX;
  undefined8 uVar5;
  undefined8 extraout_RDX_00;
  char *pcVar6;
  
  sVar3 = strlen(inst);
  if (sVar3 == 0) {
    pcVar6 = "empty instruction (this is a proble with the test)";
  }
  else {
    if (inst[sVar3 - 1] == '\n') {
      printf("about to test %s",inst);
      sh4asm_buf_len = 0;
      sh4asm_set_emitter(neo_bin_emit);
      uVar5 = extraout_RDX;
      for (; auVar2[0] = sh4asm_buf[0], cVar1 = *inst, (long)cVar1 != 0; inst = inst + 1) {
        pp_Var4 = __ctype_tolower_loc();
        sh4asm_input_char((char)(*pp_Var4)[cVar1]);
        uVar5 = extraout_RDX_00;
      }
      if (sh4asm_buf_len == 1) {
        sh4asm_disas_len = 0;
        sh4asm_disas_inst(sh4asm_buf[0],(sh4asm_disas_emit_func)(ulong)sh4asm_buf_len,
                          (uint32_t)uVar5);
        neo_asm_emit('\n');
        neo_asm_emit('\0');
        printf("The returned instruction was %s",sh4asm_disas);
        sh4asm_buf_len = 0;
        sh4asm_set_emitter(neo_bin_emit);
        for (pcVar6 = sh4asm_disas; *pcVar6 != '\0'; pcVar6 = pcVar6 + 1) {
          sh4asm_input_char(*pcVar6);
        }
        if (sh4asm_buf_len == 1) {
          if (sh4asm_buf[0] == auVar2[0]) {
            puts("success!");
            return true;
          }
          printf("Error: first assembly returned 0x%04x, second assembly returned 0x%04x\n",
                 (ulong)auVar2[0]);
          return false;
        }
      }
      printf("invalid sh4asm output length (expected 1, got %u)\n");
      return false;
    }
    pcVar6 = "instructions need to end with newlines (this is a problem with the test)";
  }
  errx(1,pcVar6);
}

Assistant:

bool test_inst(char const *inst) {
    size_t len = strlen(inst);

    if (!len)
        errx(1, "empty instruction (this is a proble with the test)");
    if (inst[len - 1] != '\n') {
        errx(1, "instructions need to end with newlines (this is a problem "
             "with the test)");
    }

    printf("about to test %s", inst);

    // first assemble the instruction
    clear_bin();
    sh4asm_set_emitter(neo_bin_emit);
    while (*inst)
        sh4asm_input_char(tolower(*inst++));
    if (sh4asm_buf_len != 1) {
        printf("invalid sh4asm output length (expected 1, got %u)\n",
               sh4asm_buf_len);
        return false;
    }
    uint16_t inst_bin = sh4asm_buf[0];

    // now disassemble it
    clear_asm();
    sh4asm_disas_inst(inst_bin, neo_asm_emit, 0);

    // add in a newline
    neo_asm_emit('\n');
    neo_asm_emit('\0');

    char const *new_inst = sh4asm_disas;

    printf("The returned instruction was %s", new_inst);

    // now reassemble the instruction
    clear_bin();
    sh4asm_set_emitter(neo_bin_emit);
    while (*new_inst)
        sh4asm_input_char(*new_inst++);
    if (sh4asm_buf_len != 1) {
        printf("invalid sh4asm output length (expected 1, got %u)\n",
               sh4asm_buf_len);
        return false;
    }

    if (sh4asm_buf[0] != inst_bin) {
        printf("Error: first assembly returned 0x%04x, second assembly "
               "returned 0x%04x\n",
               (unsigned)inst_bin, (unsigned)sh4asm_buf[0]);
        return false;
    }

    printf("success!\n");

    return true;
}